

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_window_update
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              int32_t window_size_increment)

{
  void *ptr;
  nghttp2_mem *mem_00;
  long in_RDI;
  nghttp2_mem *mem;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  nghttp2_mem *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  ptr = (void *)(in_RDI + 0xa08);
  mem_00 = (nghttp2_mem *)nghttp2_mem_malloc(in_stack_ffffffffffffffd0,(size_t)ptr);
  if (mem_00 == (nghttp2_mem *)0x0) {
    local_4 = -0x385;
  }
  else {
    nghttp2_outbound_item_init((nghttp2_outbound_item *)0x1143f6);
    nghttp2_frame_window_update_init
              ((nghttp2_window_update *)mem_00,(uint8_t)((ulong)ptr >> 0x38),(int32_t)ptr,0);
    local_4 = nghttp2_session_add_item((nghttp2_session *)&frame->hd,(nghttp2_outbound_item *)mem);
    if (local_4 == 0) {
      local_4 = 0;
    }
    else {
      nghttp2_frame_window_update_free((nghttp2_window_update *)mem_00);
      nghttp2_mem_free(mem_00,ptr);
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_add_window_update(nghttp2_session *session, uint8_t flags,
                                      int32_t stream_id,
                                      int32_t window_size_increment) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_mem *mem;

  mem = &session->mem;
  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_window_update_init(&frame->window_update, flags, stream_id,
                                   window_size_increment);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_window_update_free(&frame->window_update);
    nghttp2_mem_free(mem, item);
    return rv;
  }
  return 0;
}